

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::bitfield_insert_invalid_bits_type
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderType shaderType_00;
  string shaderSource_00;
  string shaderSource_01;
  bool bVar1;
  char *__s;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  long lVar5;
  string shaderSource;
  DataType DVar6;
  DataType offsetDataType;
  undefined4 in_stack_ffffffffffffff2c;
  DataType in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  _Alloc_hider _Var7;
  size_type sVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  allocator<char> local_a1;
  long local_a0;
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  _Var7._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff38,"bitfieldInsert: Invalid bits type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_b8) {
    operator_delete(_Var7._M_p,local_b8._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_a1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x99df33);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar3) {
        local_b8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_b8._8_8_ = plVar2[3];
        _Var7._M_p = (pointer)&local_b8;
      }
      else {
        local_b8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        _Var7._M_p = (pointer)*plVar2;
      }
      sVar8 = plVar2[1];
      *plVar2 = (long)paVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff38);
      local_58 = lVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_b8) {
        operator_delete(_Var7._M_p,local_b8._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        shaderType_00 = (&(anonymous_namespace)::s_intTypes)[lVar4];
        lVar5 = 0;
        local_a0 = lVar4;
        do {
          offsetDataType = *(DataType *)((long)&(anonymous_namespace)::s_nonScalarIntTypes + lVar5);
          DVar6 = offsetDataType;
          (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                    ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,shaderType_00,shaderType_00,TYPE_INT,
                     offsetDataType,in_stack_ffffffffffffff30);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff2c;
          shaderSource_00._M_dataplus._M_p._0_4_ = DVar6;
          shaderSource_00._M_string_length._0_4_ = in_stack_ffffffffffffff30;
          shaderSource_00._M_string_length._4_4_ = in_stack_ffffffffffffff34;
          shaderSource_00.field_2._M_allocated_capacity = (size_type)_Var7._M_p;
          shaderSource_00.field_2._8_8_ = sVar8;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_98[0],shaderSource_00);
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var7._M_p != &local_b8) {
            operator_delete(_Var7._M_p,local_b8._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                    ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,
                     (&(anonymous_namespace)::s_uintTypes)[local_a0],
                     (&(anonymous_namespace)::s_uintTypes)[local_a0],TYPE_INT,offsetDataType,
                     in_stack_ffffffffffffff30);
          local_78[0] = local_68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff2c;
          shaderSource_01._M_dataplus._M_p._0_4_ = offsetDataType;
          shaderSource_01._M_string_length._0_4_ = in_stack_ffffffffffffff30;
          shaderSource_01._M_string_length._4_4_ = in_stack_ffffffffffffff34;
          shaderSource_01.field_2._M_allocated_capacity = (size_type)_Var7._M_p;
          shaderSource_01.field_2._8_8_ = sVar8;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_78[0],shaderSource_01);
          if (local_78[0] != local_68) {
            operator_delete(local_78[0],local_68[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var7._M_p != &local_b8) {
            operator_delete(_Var7._M_p,local_b8._M_allocated_capacity + 1);
          }
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x2c);
        lVar4 = local_a0 + 1;
      } while (lVar4 != 4);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_58;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void bitfield_insert_invalid_bits_type (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("bitfieldInsert: Invalid bits type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++dataTypeNdx2)
				{
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], glu::TYPE_INT, s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], glu::TYPE_INT, s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}